

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionsPdu.cpp
# Opt level: O2

void __thiscall
DIS::ElectromagneticEmissionsPdu::unmarshal
          (ElectromagneticEmissionsPdu *this,DataStream *dataStream)

{
  ulong uVar1;
  ElectromagneticEmissionSystemData x;
  ElectromagneticEmissionSystemData EStack_78;
  
  DistributedEmissionsFamilyPdu::unmarshal(&this->super_DistributedEmissionsFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_emittingEntityID,dataStream);
  EventIdentifier::unmarshal(&this->_eventID,dataStream);
  DataStream::operator>>(dataStream,&this->_stateUpdateIndicator);
  DataStream::operator>>(dataStream,&this->_numberOfSystems);
  DataStream::operator>>(dataStream,&this->_paddingForEmissionsPdu);
  std::
  vector<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
  ::clear(&this->_systems);
  for (uVar1 = 0; uVar1 < this->_numberOfSystems; uVar1 = uVar1 + 1) {
    ElectromagneticEmissionSystemData::ElectromagneticEmissionSystemData(&EStack_78);
    ElectromagneticEmissionSystemData::unmarshal(&EStack_78,dataStream);
    std::
    vector<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
    ::push_back(&this->_systems,&EStack_78);
    ElectromagneticEmissionSystemData::~ElectromagneticEmissionSystemData(&EStack_78);
  }
  return;
}

Assistant:

void ElectromagneticEmissionsPdu::unmarshal(DataStream& dataStream)
{
    DistributedEmissionsFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _emittingEntityID.unmarshal(dataStream);
    _eventID.unmarshal(dataStream);
    dataStream >> _stateUpdateIndicator;
    dataStream >> _numberOfSystems;
    dataStream >> _paddingForEmissionsPdu;

    _systems.clear();
    for(size_t idx = 0; idx < _numberOfSystems; idx++)
    {
        ElectromagneticEmissionSystemData x;
        x.unmarshal(dataStream);
        _systems.push_back(x);
    }
}